

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O0

void __thiscall QPDFArgParser::invalidHelpArg(QPDFArgParser *this,string *p)

{
  ulong uVar1;
  bool bVar2;
  allocator<char> local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *p_local;
  QPDFArgParser *this_local;
  
  local_18 = p;
  p_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"unknown help option",&local_59);
  uVar1 = std::__cxx11::string::empty();
  bVar2 = (uVar1 & 1) != 0;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"",&local_91);
  }
  else {
    std::operator+(&local_90," ",local_18);
  }
  std::operator+(&local_38,&local_58,&local_90);
  usage(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_90);
  if (bVar2) {
    std::allocator<char>::~allocator(&local_91);
  }
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  return;
}

Assistant:

void
QPDFArgParser::invalidHelpArg(std::string const& p)
{
    usage(std::string("unknown help option") + (p.empty() ? "" : (" " + p)));
}